

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void vera::setMousePosition(float _x,float _y)

{
  int iVar1;
  float fVar2;
  float y;
  float h;
  float _y_local;
  float _x_local;
  
  mouse.velX = 0.0;
  mouse.velY = 0.0;
  mouse.x = _x;
  mouse.y = _y;
  mouse.drag.field_0.x = _x;
  mouse.drag.field_1.y = _y;
  iVar1 = getWindowHeight();
  fVar2 = glm::clamp<float>(_y,0.0,(float)iVar1);
  glfwSetCursorPos(window,(double)(_x / fPixelDensity),
                   (double)(((float)iVar1 - fVar2) / fPixelDensity));
  return;
}

Assistant:

void    setMousePosition( float _x, float _y ) {
    mouse.x = _x;
    mouse.y = _y;
    mouse.velX = 0.0f;
    mouse.velY = 0.0f;
    mouse.drag.x = _x;
    mouse.drag.y = _y;
    #if defined(DRIVER_GLFW)
    float h = getWindowHeight();
    float y = h - glm::clamp(_y, 0.0f, h);
    glfwSetCursorPos(window, _x / fPixelDensity , y / fPixelDensity);
    #endif
}